

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterReferencedByCase::iterate
          (AtomicCounterReferencedByCase *this)

{
  Program *programDefinition;
  long lVar1;
  code *pcVar2;
  bool bVar3;
  ContextType ctxType;
  ApiType requiredApiType;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestLog *pTVar7;
  ContextInfo *this_00;
  MessageBuilder *pMVar8;
  char *pcVar9;
  Enum<int,_2UL> EVar10;
  MessageBuilder local_888;
  GetNameFunc local_708;
  int local_700;
  Enum<int,_2UL> local_6f8;
  char *local_6e8;
  MessageBuilder local_6e0;
  MessageBuilder local_560;
  char *local_3e0;
  char *local_3d8;
  MessageBuilder local_3d0;
  int local_250;
  int local_24c;
  GLint written;
  GLint value;
  GLint expected;
  GLenum prop;
  int propNdx;
  ProgramSources local_230;
  undefined1 local_160 [8];
  ShaderProgram program;
  Functions *gl;
  anon_struct_16_3_2a984f3a targetProps [6];
  bool supportsES32;
  AtomicCounterReferencedByCase *this_local;
  
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar3 = glu::contextSupports(ctxType,requiredApiType);
  targetProps[0].propName = 0;
  targetProps[0].shaderType = SHADERTYPE_VERTEX;
  targetProps[0].extension._0_4_ = 0x930a;
  targetProps[0].extension._4_4_ = 1;
  targetProps[1].propName = 0;
  targetProps[1].shaderType = SHADERTYPE_VERTEX;
  targetProps[1].extension._0_4_ = 0x930b;
  targetProps[1].extension._4_4_ = 5;
  targetProps[2].propName = 0;
  targetProps[2].shaderType = SHADERTYPE_VERTEX;
  targetProps[2].extension._0_4_ = 0x9307;
  targetProps[2].extension._4_4_ = 3;
  pcVar9 = (char *)0x0;
  targetProps[3]._0_8_ = "GL_EXT_tessellation_shader";
  if (bVar3) {
    targetProps[3]._0_8_ = pcVar9;
  }
  targetProps[3].extension._0_4_ = 0x9308;
  targetProps[3].extension._4_4_ = 4;
  targetProps[4]._0_8_ = "GL_EXT_tessellation_shader";
  if (bVar3) {
    targetProps[4]._0_8_ = pcVar9;
  }
  targetProps[4].extension._0_4_ = 0x9309;
  targetProps[4].extension._4_4_ = 2;
  targetProps[5]._0_8_ = "GL_EXT_geometry_shader";
  if (bVar3) {
    targetProps[5]._0_8_ = pcVar9;
  }
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar4);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  generateProgramInterfaceProgramSources(&local_230,this->m_program);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_160,pRVar6,&local_230);
  glu::ProgramSources::~ProgramSources(&local_230);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  programDefinition = this->m_program;
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  checkAndLogProgram((ShaderProgram *)local_160,programDefinition,
                     (Functions *)CONCAT44(extraout_var_00,iVar4),pTVar7);
  expected = 0;
  do {
    if (5 < expected) {
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_160);
      return STOP;
    }
    lVar1._0_4_ = targetProps[expected].propName;
    lVar1._4_4_ = targetProps[expected].shaderType;
    if (lVar1 == 0) {
LAB_022576e8:
      value = *(GLint *)&targetProps[(long)expected + -1].extension;
      written = (GLint)((this->m_activeStagesMask >>
                         (*(uint *)((long)&targetProps[(long)expected + -1].extension + 4) & 0x1f) &
                        1) != 0);
      local_24c = -1;
      local_250 = -1;
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3d0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<(&local_3d0,(char (*) [11])"Verifying ");
      local_3d8 = glu::getProgramResourcePropertyName(value);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3d8);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [13])0x2c2d409);
      local_3e0 = glu::getBooleanName(written);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3e0);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3d0);
      pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9c8);
      dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
      (*pcVar2)(dVar5,0x92c0,0,1,&value,1,&local_250,&local_24c);
      dVar5 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
      glu::checkError(dVar5,"query buffer binding",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0xaf2);
      if (local_250 == 1) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_6e0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        local_6e8 = glu::getProgramResourcePropertyName(value);
        pMVar8 = tcu::MessageBuilder::operator<<(&local_6e0,&local_6e8);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x2be9a12);
        EVar10 = glu::getBooleanStr(local_24c);
        local_708 = EVar10.m_getName;
        local_700 = EVar10.m_value;
        local_6f8.m_getName = local_708;
        local_6f8.m_value = local_700;
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_6f8);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_6e0);
        if (local_24c != written) {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_888,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_888,(char (*) [28])"Error, got unexpected value");
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_888);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"unexpected property value");
        }
      }
      else {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_560,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_560,
                            (char (*) [68])
                            "Error, query for referenced_by_* returned invalid number of values.");
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_560);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"property query failed");
      }
    }
    else {
      this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      bVar3 = glu::ContextInfo::isExtensionSupported(this_00,*(char **)(targetProps + expected));
      if (bVar3) goto LAB_022576e8;
    }
    expected = expected + 1;
  } while( true );
}

Assistant:

AtomicCounterReferencedByCase::IterateResult AtomicCounterReferencedByCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	const struct
	{
		glw::GLenum		propName;
		glu::ShaderType	shaderType;
		const char*		extension;
	} targetProps[] =
	{
		{ GL_REFERENCED_BY_VERTEX_SHADER,			glu::SHADERTYPE_VERTEX,						DE_NULL												},
		{ GL_REFERENCED_BY_FRAGMENT_SHADER,			glu::SHADERTYPE_FRAGMENT,					DE_NULL												},
		{ GL_REFERENCED_BY_COMPUTE_SHADER,			glu::SHADERTYPE_COMPUTE,					DE_NULL												},
		{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		glu::SHADERTYPE_TESSELLATION_CONTROL,		(supportsES32 ? DE_NULL : "GL_EXT_tessellation_shader")	},
		{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	glu::SHADERTYPE_TESSELLATION_EVALUATION,	(supportsES32 ? DE_NULL : "GL_EXT_tessellation_shader")	},
		{ GL_REFERENCED_BY_GEOMETRY_SHADER,			glu::SHADERTYPE_GEOMETRY,					(supportsES32 ? DE_NULL : "GL_EXT_geometry_shader")		},
	};

	const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program		(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// check props
	for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(targetProps); ++propNdx)
	{
		if (targetProps[propNdx].extension == DE_NULL || m_context.getContextInfo().isExtensionSupported(targetProps[propNdx].extension))
		{
			const glw::GLenum	prop		= targetProps[propNdx].propName;
			const glw::GLint	expected	= ((m_activeStagesMask & (1 << targetProps[propNdx].shaderType)) != 0) ? (GL_TRUE) : (GL_FALSE);
			glw::GLint			value		= -1;
			glw::GLint			written		= -1;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying " << glu::getProgramResourcePropertyName(prop) << ", expecting " << glu::getBooleanName(expected) << tcu::TestLog::EndMessage;

			gl.getProgramResourceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, 0, 1, &prop, 1, &written, &value);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query buffer binding");

			if (written != 1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for referenced_by_* returned invalid number of values." << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "property query failed");
				continue;
			}

			m_testCtx.getLog() << tcu::TestLog::Message << glu::getProgramResourcePropertyName(prop) << " = " << glu::getBooleanStr(value) << tcu::TestLog::EndMessage;

			if (value != expected)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected value" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "unexpected property value");
				continue;
			}
		}
	}

	return STOP;
}